

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

size_t __thiscall
kj::FdInputStream::tryRead(FdInputStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  int code;
  void *pvVar1;
  Fault local_78;
  Fault f;
  SyscallResult local_4c;
  undefined1 auStack_48 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  byte *max;
  byte *min;
  byte *pos;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  FdInputStream *this_local;
  
  for (min = (byte *)buffer; min < (byte *)((long)buffer + minBytes);
      min = (byte *)(_auStack_48 + (long)min)) {
    f.exception = (Exception *)auStack_48;
    local_4c = _::Debug::syscall<kj::FdInputStream::tryRead(void*,unsigned_long,unsigned_long)::__0>
                         ((anon_class_32_4_b05fb1ff *)&f,false);
    pvVar1 = _::Debug::SyscallResult::operator_cast_to_void_(&local_4c);
    if (pvVar1 == (void *)0x0) {
      code = _::Debug::SyscallResult::getErrorNumber(&local_4c);
      _::Debug::Fault::Fault<int,int&>
                (&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                 ,0x15d,code,"n = miniposix::read(fd, pos, max - pos)","fd",&this->fd);
      _::Debug::Fault::fatal(&local_78);
    }
    if (_auStack_48 == (char *)0x0) break;
  }
  return (long)min - (long)buffer;
}

Assistant:

size_t FdInputStream::tryRead(void* buffer, size_t minBytes, size_t maxBytes) {
  byte* pos = reinterpret_cast<byte*>(buffer);
  byte* min = pos + minBytes;
  byte* max = pos + maxBytes;

  while (pos < min) {
    miniposix::ssize_t n;
    KJ_SYSCALL(n = miniposix::read(fd, pos, max - pos), fd);
    if (n == 0) {
      break;
    }
    pos += n;
  }

  return pos - reinterpret_cast<byte*>(buffer);
}